

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

void __thiscall QTextCursorPrivate::setX(QTextCursorPrivate *this)

{
  QTextDocumentPrivate *pQVar1;
  qreal qVar2;
  uint uVar3;
  int iVar4;
  QTextLayout *this_00;
  int iVar5;
  long in_FS_OFFSET;
  undefined4 uVar6;
  undefined4 uVar7;
  QTextLine QVar8;
  undefined1 *local_58;
  QTextEngine *pQStack_50;
  int local_3c;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->priv;
  if ((pQVar1->editBlock == 0) && (pQVar1->inContentsChange != true)) {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uVar3 = QFragmentMapData<QTextBlockData>::findNode(&(pQVar1->blocks).data,this->position,0);
    local_38._8_4_ = uVar3;
    local_38._0_8_ = pQVar1;
    this_00 = blockLayout(this,(QTextBlock *)local_38);
    iVar5 = this->position;
    iVar4 = QTextBlock::position((QTextBlock *)local_38);
    iVar5 = iVar5 - iVar4;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QVar8 = QTextLayout::lineForTextPosition(this_00,iVar5);
    pQStack_50 = QVar8.eng;
    local_58 = (undefined1 *)CONCAT44(local_58._4_4_,QVar8.index);
    if (pQStack_50 == (QTextEngine *)0x0) {
      uVar6 = 0;
      uVar7 = 0xbff00000;
    }
    else {
      local_3c = iVar5;
      qVar2 = QTextLine::cursorToX((QTextLine *)&local_58,&local_3c,Leading);
      uVar6 = SUB84(qVar2,0);
      uVar7 = (undefined4)((ulong)qVar2 >> 0x20);
    }
    this->x = (qreal)CONCAT44(uVar7,uVar6);
  }
  else {
    this->x = -1.0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursorPrivate::setX()
{
    if (priv->isInEditBlock() || priv->inContentsChange) {
        x = -1; // mark dirty
        return;
    }

    QTextBlock block = this->block();
    const QTextLayout *layout = blockLayout(block);
    int pos = position - block.position();

    QTextLine line = layout->lineForTextPosition(pos);
    if (line.isValid())
        x = line.cursorToX(pos);
    else
        x = -1; // delayed init.  Makes movePosition() call setX later on again.
}